

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<QString,_ProStringList>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QString,_ProStringList>_> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<std::pair<QString,_ProStringList>_> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  pair<QString,_ProStringList> *ppVar3;
  bool bVar4;
  long lVar5;
  qsizetype qVar6;
  pair<QString,_ProStringList> *b;
  pair<QString,_ProStringList> *e;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QArrayDataPointer<std::pair<QString,_ProStringList>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<std::pair<QString,_ProStringList>_> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar6 = 0;
        lVar5 = 0;
      }
      else {
        qVar6 = pQVar1->alloc;
        lVar5 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
                -0x5555555555555555;
      }
      auVar7 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x30,qVar6 + n + lVar5,Grow);
      this->d = (Data *)auVar7._0_8_;
      this->ptr = (pair<QString,_ProStringList> *)auVar7._8_8_;
      goto LAB_002475c7;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (pair<QString,_ProStringList> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  ppVar3 = local_48.ptr;
  if (this->size != 0) {
    lVar5 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    b = this->ptr;
    e = b + lVar5;
    if ((old != (QArrayDataPointer<std::pair<QString,_ProStringList>_> *)0x0) || (bVar4)) {
      if ((lVar5 != 0) && (0 < lVar5)) {
        do {
          std::pair<QString,_ProStringList>::pair(ppVar3 + local_48.size,b);
          b = b + 1;
          local_48.size = local_48.size + 1;
        } while (b < e);
      }
    }
    else {
      QtPrivate::QGenericArrayOps<std::pair<QString,_ProStringList>_>::moveAppend
                ((QGenericArrayOps<std::pair<QString,_ProStringList>_> *)&local_48,b,e);
    }
  }
  pDVar2 = this->d;
  ppVar3 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar6 = this->size;
  this->size = local_48.size;
  local_48.d = pDVar2;
  local_48.ptr = ppVar3;
  local_48.size = qVar6;
  if (old != (QArrayDataPointer<std::pair<QString,_ProStringList>_> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = pDVar2;
    old->ptr = ppVar3;
    local_48.size = old->size;
    old->size = qVar6;
  }
  ~QArrayDataPointer(&local_48);
LAB_002475c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }